

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

size_t zt_cstr_pos(char *s,ssize_t i)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = strlen(s);
  sVar3 = (i >> 0x3f & sVar1) + i;
  sVar2 = sVar1 - 1;
  if ((long)sVar3 < (long)sVar1) {
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

size_t
zt_cstr_pos(const char *s, ssize_t i) {
    size_t len;

    zt_assert(s);

    len = strlen(s);
    i   = (ssize_t)IDX(i, len);

    zt_assert(i >= 0 && (size_t)i <= len);
    return (size_t)i;
}